

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::MergeUsingImpl
          (Parser *this,ZeroCopyInputStream *param_2,Message *output,ParserImpl *parser_impl)

{
  bool bVar1;
  ulong uVar2;
  long *in_RDX;
  ParserImpl *in_RDI;
  string *in_stack_00000060;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  missing_fields;
  Message *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff98;
  Message *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  long *local_20;
  byte local_1;
  
  local_20 = in_RDX;
  bVar1 = ParserImpl::Parse(in_RDI,in_stack_ffffffffffffff60);
  if (bVar1) {
    if (((ulong)(in_RDI->tokenizer_error_collector_).super_ErrorCollector._vptr_ErrorCollector & 1)
        == 0) {
      uVar2 = (**(code **)(*local_20 + 0x40))();
      if ((uVar2 & 1) == 0) {
        __rhs = &local_40;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x45570e);
        Message::FindInitializationErrors(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
        std::operator+((char *)in_RDI,__rhs);
        ParserImpl::ReportError
                  ((ParserImpl *)
                   missing_fields.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   missing_fields.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._4_4_,
                   (int)missing_fields.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,in_stack_00000060);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
        local_1 = 0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(in_stack_ffffffffffffff70);
        goto LAB_004557f3;
      }
    }
    local_1 = 1;
  }
  else {
    local_1 = 0;
  }
LAB_004557f3:
  return (bool)(local_1 & 1);
}

Assistant:

bool TextFormat::Parser::MergeUsingImpl(io::ZeroCopyInputStream* /* input */,
                                        Message* output,
                                        ParserImpl* parser_impl) {
  if (!parser_impl->Parse(output)) return false;
  if (!allow_partial_ && !output->IsInitialized()) {
    std::vector<std::string> missing_fields;
    output->FindInitializationErrors(&missing_fields);
    parser_impl->ReportError(-1, 0,
                             "Message missing required fields: " +
                                 Join(missing_fields, ", "));
    return false;
  }
  return true;
}